

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode setname(curl_mimepart *part,char *name,size_t len)

{
  char *name_00;
  CURLcode res;
  char *zname;
  size_t len_local;
  char *name_local;
  curl_mimepart *part_local;
  
  if ((name == (char *)0x0) || (len == 0)) {
    part_local._4_4_ = curl_mime_name(part,name);
  }
  else {
    name_00 = (char *)(*Curl_cmalloc)(len + 1);
    if (name_00 == (char *)0x0) {
      part_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      memcpy(name_00,name,len);
      name_00[len] = '\0';
      part_local._4_4_ = curl_mime_name(part,name_00);
      (*Curl_cfree)(name_00);
    }
  }
  return part_local._4_4_;
}

Assistant:

static CURLcode setname(curl_mimepart *part, const char *name, size_t len)
{
  char *zname;
  CURLcode res;

  if(!name || !len)
    return curl_mime_name(part, name);
  zname = malloc(len + 1);
  if(!zname)
    return CURLE_OUT_OF_MEMORY;
  memcpy(zname, name, len);
  zname[len] = '\0';
  res = curl_mime_name(part, zname);
  free(zname);
  return res;
}